

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase63::run(TestCase63 *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Maybe<kj::Exception> e;
  AddFailureAdapter local_188;
  Maybe<kj::Exception> local_170;
  
  local_188._0_8_ = &PTR_run_001b91d0;
  runCatchingExceptions(&local_170,(Runnable *)&local_188);
  if (local_170.ptr.isSet == true) {
    uVar1 = (undefined **)0x199111;
    if (local_170.ptr.field_1.value.description.content.size_ != 0) {
      uVar1 = local_170.ptr.field_1.value.description.content.ptr;
    }
    if (((local_170.ptr.field_1.value.description.content.size_ != 0x14) ||
        (auVar3[0] = -(local_170.ptr.field_1.value.description.content.ptr[3] == ':'),
        auVar3[1] = -(local_170.ptr.field_1.value.description.content.ptr[4] == ':'),
        auVar3[2] = -(local_170.ptr.field_1.value.description.content.ptr[5] == 'e'),
        auVar3[3] = -(local_170.ptr.field_1.value.description.content.ptr[6] == 'x'),
        auVar3[4] = -(local_170.ptr.field_1.value.description.content.ptr[7] == 'c'),
        auVar3[5] = -(local_170.ptr.field_1.value.description.content.ptr[8] == 'e'),
        auVar3[6] = -(local_170.ptr.field_1.value.description.content.ptr[9] == 'p'),
        auVar3[7] = -(local_170.ptr.field_1.value.description.content.ptr[10] == 't'),
        auVar3[8] = -(local_170.ptr.field_1.value.description.content.ptr[0xb] == 'i'),
        auVar3[9] = -(local_170.ptr.field_1.value.description.content.ptr[0xc] == 'o'),
        auVar3[10] = -(local_170.ptr.field_1.value.description.content.ptr[0xd] == 'n'),
        auVar3[0xb] = -(local_170.ptr.field_1.value.description.content.ptr[0xe] == ':'),
        auVar3[0xc] = -(local_170.ptr.field_1.value.description.content.ptr[0xf] == ' '),
        auVar3[0xd] = -(local_170.ptr.field_1.value.description.content.ptr[0x10] == 'f'),
        auVar3[0xe] = -(local_170.ptr.field_1.value.description.content.ptr[0x11] == 'o'),
        auVar3[0xf] = -(local_170.ptr.field_1.value.description.content.ptr[0x12] == 'o'),
        auVar2[0] = -(*local_170.ptr.field_1.value.description.content.ptr == 's'),
        auVar2[1] = -(local_170.ptr.field_1.value.description.content.ptr[1] == 't'),
        auVar2[2] = -(local_170.ptr.field_1.value.description.content.ptr[2] == 'd'),
        auVar2[3] = -(local_170.ptr.field_1.value.description.content.ptr[3] == ':'),
        auVar2[4] = -(local_170.ptr.field_1.value.description.content.ptr[4] == ':'),
        auVar2[5] = -(local_170.ptr.field_1.value.description.content.ptr[5] == 'e'),
        auVar2[6] = -(local_170.ptr.field_1.value.description.content.ptr[6] == 'x'),
        auVar2[7] = -(local_170.ptr.field_1.value.description.content.ptr[7] == 'c'),
        auVar2[8] = -(local_170.ptr.field_1.value.description.content.ptr[8] == 'e'),
        auVar2[9] = -(local_170.ptr.field_1.value.description.content.ptr[9] == 'p'),
        auVar2[10] = -(local_170.ptr.field_1.value.description.content.ptr[10] == 't'),
        auVar2[0xb] = -(local_170.ptr.field_1.value.description.content.ptr[0xb] == 'i'),
        auVar2[0xc] = -(local_170.ptr.field_1.value.description.content.ptr[0xc] == 'o'),
        auVar2[0xd] = -(local_170.ptr.field_1.value.description.content.ptr[0xd] == 'n'),
        auVar2[0xe] = -(local_170.ptr.field_1.value.description.content.ptr[0xe] == ':'),
        auVar2[0xf] = -(local_170.ptr.field_1.value.description.content.ptr[0xf] == ' '),
        auVar2 = auVar2 & auVar3,
        (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) != 0xffff)) && (Debug::minSeverity < 3)) {
      local_188._0_8_ = uVar1;
      local_188.file =
           (char *)(local_170.ptr.field_1.value.description.content.size_ +
                   (local_170.ptr.field_1.value.description.content.size_ == 0));
      Debug::log<char_const(&)[67],char_const(&)[20],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x45,ERROR,
                 "\"failed: expected \" \"(\\\"std::exception: foo\\\") == (ex->getDescription())\", \"std::exception: foo\", ex->getDescription()"
                 ,(char (*) [67])
                  "failed: expected (\"std::exception: foo\") == (ex->getDescription())",
                 (char (*) [20])"std::exception: foo",(StringPtr *)&local_188);
    }
  }
  else {
    local_188.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
    ;
    local_188.line = 0x47;
    local_188.handled = true;
    Debug::log<char_const(&)[19],char_const(&)[19]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x47,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [19])"Expected exception");
    AddFailureAdapter::~AddFailureAdapter(&local_188);
  }
  if (local_170.ptr.isSet == true) {
    Exception::~Exception(&local_170.ptr.field_1.value);
  }
  return;
}

Assistant:

TEST(String, Nullptr) {
  EXPECT_EQ(String(nullptr), "");
  EXPECT_EQ(StringPtr(String(nullptr)).size(), 0u);
  EXPECT_EQ(StringPtr(String(nullptr))[0], '\0');
}